

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

void __thiscall
FIX::ScreenLogFactory::ScreenLogFactory(ScreenLogFactory *this,SessionSettings *settings)

{
  SessionSettings *settings_local;
  ScreenLogFactory *this_local;
  
  LogFactory::LogFactory((LogFactory *)this);
  *(undefined **)this = &FIX::Message::typeinfo;
  this[0xb] = (ScreenLogFactory)0x1;
  SessionSettings::SessionSettings((SessionSettings *)(this + 0x10),settings);
  return;
}

Assistant:

ScreenLogFactory( const SessionSettings& settings )
: m_useSettings( true ), m_settings( settings ) {}